

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keylog.c
# Opt level: O2

_Bool Curl_tls_keylog_write_line(char *line)

{
  FILE *__stream;
  size_t __n;
  char buf [256];
  char acStack_118 [256];
  
  __stream = keylog_file_fp;
  if ((line != (char *)0x0 && keylog_file_fp != (FILE *)0x0) &&
     (__n = strlen(line), 0xffffffffffffff01 < __n - 0xff)) {
    memcpy(acStack_118,line,__n);
    if (line[__n - 1] != '\n') {
      acStack_118[__n] = '\n';
      __n = __n + 1;
    }
    acStack_118[__n] = '\0';
    fputs(acStack_118,(FILE *)__stream);
    return true;
  }
  return false;
}

Assistant:

bool
Curl_tls_keylog_write_line(const char *line)
{
  /* The current maximum valid keylog line length LF and NUL is 195. */
  size_t linelen;
  char buf[256];

  if(!keylog_file_fp || !line) {
    return false;
  }

  linelen = strlen(line);
  if(linelen == 0 || linelen > sizeof(buf) - 2) {
    /* Empty line or too big to fit in a LF and NUL. */
    return false;
  }

  memcpy(buf, line, linelen);
  if(line[linelen - 1] != '\n') {
    buf[linelen++] = '\n';
  }
  buf[linelen] = '\0';

  /* Using fputs here instead of fprintf since libcurl's fprintf replacement
     may not be thread-safe. */
  fputs(buf, keylog_file_fp);
  return true;
}